

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O1

void __thiscall QLineEditPrivate::textChanged(QLineEditPrivate *this,QString *text)

{
  int iVar1;
  
  if ((((this->leadingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->leadingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish) ||
      ((this->trailingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (this->trailingSideWidgets).
       super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish)) &&
     ((iVar1 = (int)(text->d).size, iVar1 == 0 || (this->lastTextSize == 0)))) {
    this->lastTextSize = iVar1;
    displayWidgets(&this->leadingSideWidgets,0 < iVar1);
    displayWidgets(&this->trailingSideWidgets,0 < iVar1);
    return;
  }
  return;
}

Assistant:

void QLineEditPrivate::textChanged(const QString &text)
{
    if (hasSideWidgets()) {
        const int newTextSize = text.size();
        if (!newTextSize || !lastTextSize) {
            lastTextSize = newTextSize;
#if QT_CONFIG(animation) && QT_CONFIG(toolbutton)
            const bool display = newTextSize > 0;
            displayWidgets(leadingSideWidgets, display);
            displayWidgets(trailingSideWidgets, display);
#endif
        }
    }
}